

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::
genTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  byte bVar2;
  char *pcVar3;
  bool *pbVar4;
  char *pcVar5;
  bool bVar6;
  ostringstream buf;
  undefined1 auStack_1a8 [376];
  
  bVar2 = (*(byte *)((long)this + 0x81) ^ 1) & *(byte *)((long)this + 0xd8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",0x34);
  pcVar3 = "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
  pcVar5 = glcts::fixed_sample_locations_values + 1;
  if (bVar2 == 0) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar1 = 0x23;
  if (bVar2 == 0) {
    lVar1 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar3,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,
             "layout(quads, point_mode) in;\nin highp vec4 tess_ctrl_color[];\nout highp vec4 tess_color;\nuniform highp vec4 u_posScale;\n\npatch in highp vec3 vp_bbox_clipMin;\npatch in highp vec3 vp_bbox_clipMax;\n"
             ,0xc4);
  pbVar4 = (bool *)0x1c85162;
  bVar6 = *(char *)((long)this + 0x81) != '\0';
  if (bVar6) {
    pbVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar1 = 0x2b;
  if (bVar6) {
    lVar1 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pbVar4,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"flat out highp vec3 v_",0x16);
  pcVar3 = glcts::fixed_sample_locations_values + 1;
  if (*(byte *)((long)this + 0x81) != 0) {
    pcVar3 = "geo_";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,pcVar3,(ulong)*(byte *)((long)this + 0x81) << 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"bbox_clipMin;\nflat out highp vec3 v_",0x24);
  pcVar3 = glcts::fixed_sample_locations_values + 1;
  if (*(byte *)((long)this + 0x81) != 0) {
    pcVar3 = "geo_";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,pcVar3,(ulong)*(byte *)((long)this + 0x81) << 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"bbox_clipMax;\n\n",0xf)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,
             "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
             ,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,
             "void main()\n{\n\t// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n\thighp float pointSize = "
             ,0x112);
  pcVar3 = "1.0";
  if (bVar2 != 0) {
    pcVar3 = "(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)";
  }
  lVar1 = 3;
  if (bVar2 != 0) {
    lVar1 = 0x2c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar3,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,
             ";\n\tgl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n",0x3e);
  if (bVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1a8,"\tgl_PointSize = pointSize;\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"\ttess_color = tess_ctrl_color[0];\n",0x22);
  pcVar3 = "v_bbox_expansionSize = pointSize;\n";
  lVar1 = 0x22;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    lVar1 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar3,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"\tv_",3);
  pcVar3 = glcts::fixed_sample_locations_values + 1;
  if (*(byte *)((long)this + 0x81) != 0) {
    pcVar3 = "geo_";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,pcVar3,(ulong)*(byte *)((long)this + 0x81) << 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"bbox_clipMin = vp_bbox_clipMin;\n\tv_",0x23);
  if (*(byte *)((long)this + 0x81) != 0) {
    pcVar5 = "geo_";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,pcVar5,(ulong)*(byte *)((long)this + 0x81) << 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"bbox_clipMax = vp_bbox_clipMax;\n}\n",0x22);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genTessellationEvaluationSource (void) const
{
	const bool			tessellationWidePoints = (m_isWidePointCase) && (!m_hasGeometryStage);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
		<<	((tessellationWidePoints) ? ("${TESSELLATION_POINT_SIZE_REQUIRE}\n") : (""))
		<<	"layout(quads, point_mode) in;"
			"\n"
			"in highp vec4 tess_ctrl_color[];\n"
			"out highp vec4 tess_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"patch in highp vec3 vp_bbox_clipMin;\n"
			"patch in highp vec3 vp_bbox_clipMax;\n"
		<<	((!m_hasGeometryStage) ? ("flat out highp float v_bbox_expansionSize;\n") : (""))
		<<	"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_Y)
		<<	"void main()\n"
			"{\n"
			"	// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n"
			"	highp float pointSize = " << ((tessellationWidePoints) ? ("(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)") : ("1.0")) << ";\n"
			"	gl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n";

	if (tessellationWidePoints)
		buf << "	gl_PointSize = pointSize;\n";

	buf <<	"	tess_color = tess_ctrl_color[0];\n"
		<<	((!m_hasGeometryStage) ? ("v_bbox_expansionSize = pointSize;\n") : (""))
		<<	"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin = vp_bbox_clipMin;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax = vp_bbox_clipMax;\n"
			"}\n";

	return buf.str();
}